

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

bool checkParsed(QByteArrayView num,qsizetype used)

{
  char cVar1;
  qsizetype qVar2;
  long in_RDX;
  long in_FS_OFFSET;
  qsizetype len;
  bool local_31;
  qsizetype local_28;
  bool local_19;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX < 1) {
    local_19 = false;
  }
  else {
    qVar2 = QByteArrayView::size(&local_18);
    local_28 = in_RDX;
    if ((in_RDX < qVar2) && (cVar1 = QByteArrayView::operator[](&local_18,in_RDX), cVar1 != '\0')) {
      while( true ) {
        local_31 = false;
        if (local_28 < qVar2) {
          QByteArrayView::operator[](&local_18,local_28);
          local_31 = ascii_isspace('\0');
        }
        if (local_31 == false) break;
        local_28 = local_28 + 1;
      }
    }
    if ((local_28 < qVar2) &&
       (cVar1 = QByteArrayView::operator[](&local_18,local_28), cVar1 != '\0')) {
      local_19 = false;
    }
    else {
      local_19 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_19;
}

Assistant:

static bool checkParsed(QByteArrayView num, qsizetype used)
{
    if (used <= 0)
        return false;

    const qsizetype len = num.size();
    if (used < len && num[used] != '\0') {
        while (used < len && ascii_isspace(num[used]))
            ++used;
    }

    if (used < len && num[used] != '\0')
        // we stopped at a non-digit character after converting some digits
        return false;

    return true;
}